

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::setRngSeed(ConfigData *config,string *seed)

{
  bool bVar1;
  byte bVar2;
  time_t tVar3;
  runtime_error *this;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  string *local_18;
  string *seed_local;
  ConfigData *config_local;
  
  local_18 = seed;
  seed_local = (string *)config;
  bVar1 = std::operator==(seed,"time");
  if (bVar1) {
    tVar3 = time((time_t *)0x0);
    *(int *)&seed_local->field_2 = (int)tVar3;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,(string *)local_18);
    std::istream::operator>>
              ((istream *)local_1a0,(uint *)&(seed_local->field_2)._M_allocated_capacity);
    bVar2 = std::ios::fail();
    if ((bVar2 & 1) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,"Argument to --rng-seed should be the word \'time\' or a number");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  return;
}

Assistant:

inline void setRngSeed( ConfigData& config, std::string const& seed ) {
        if( seed == "time" ) {
            config.rngSeed = static_cast<unsigned int>( std::time(0) );
        }
        else {
            std::stringstream ss;
            ss << seed;
            ss >> config.rngSeed;
            if( ss.fail() )
                throw std::runtime_error( "Argument to --rng-seed should be the word 'time' or a number" );
        }
    }